

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

bool Fossilize::write_buffer_to_file(char *path,void *data,size_t size)

{
  FILE *__s;
  size_t sVar1;
  FILE *file;
  size_t size_local;
  void *data_local;
  char *path_local;
  
  __s = fopen(path,"wb");
  if (__s == (FILE *)0x0) {
    path_local._7_1_ = false;
  }
  else {
    sVar1 = fwrite(data,1,size,__s);
    if (sVar1 == size) {
      fclose(__s);
      path_local._7_1_ = true;
    }
    else {
      fclose(__s);
      path_local._7_1_ = false;
    }
  }
  return path_local._7_1_;
}

Assistant:

bool write_buffer_to_file(const char *path, const void *data, size_t size)
{
	FILE *file = fopen(path, "wb");
	if (!file)
		return false;

	if (fwrite(data, 1, size, file) != size)
	{
		fclose(file);
		return false;
	}

	fclose(file);
	return true;
}